

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManSetMark0Dfs_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  if ((*(ulong *)pObj_00 >> 0x1e & 1) == 0) {
    *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffbfffffff | 0x40000000;
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      Gia_ManSetMark0Dfs_rec(p,iVar1);
      iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
      Gia_ManSetMark0Dfs_rec(p,iVar1);
    }
  }
  return;
}

Assistant:

void Gia_ManSetMark0Dfs_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    pObj = Gia_ManObj( p, iObj );
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Gia_ManSetMark0Dfs_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    Gia_ManSetMark0Dfs_rec( p, Gia_ObjFaninId1(pObj, iObj) );
}